

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  bool bVar1;
  pointer __n;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  iterator __first;
  iterator __last;
  mz_ulong __n_00;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  long lVar8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  uchar *local_238;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_228;
  const_iterator local_220;
  uint local_214;
  uint local_210;
  uint data_len_2;
  uint outSize_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  uint bufLen;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  uchar *local_1d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  const_iterator local_1c0;
  uint local_1b4;
  uint uStack_1b0;
  uint data_len_1;
  tinyexr_uint64 outSize_1;
  undefined1 local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  uchar *local_178;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_170;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  const_iterator local_160;
  uint local_154;
  uint uStack_150;
  uint data_len;
  tinyexr_uint64 outSize;
  undefined1 local_140 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  const_iterator local_108;
  uint local_100;
  int local_fc;
  uint val_2;
  int x_4;
  uint *line_ptr_4;
  float local_e8;
  int y_4;
  float val_1;
  int x_3;
  float *line_ptr_3;
  int y_3;
  FP16 local_cc;
  FP32 local_c8;
  FP16 h16_1;
  FP32 f32_1;
  int x_2;
  unsigned_short *line_ptr_2;
  int y_2;
  int local_ac;
  unsigned_short val;
  reference pvStack_a8;
  int x_1;
  unsigned_short *line_ptr_1;
  FP16 local_98;
  int y_1;
  FP16 local_90;
  FP32 f32;
  FP16 h16;
  int x;
  float *line_ptr;
  size_type sStack_78;
  int y;
  size_t c;
  size_t start_y;
  allocator<unsigned_char> local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t buf_size;
  int param_5_local;
  int width_local;
  int param_3_local;
  int compression_type_local;
  uchar **images_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  
  __n = (pointer)((long)width * (long)num_lines * pixel_data_size);
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<unsigned_char>::allocator(&local_51);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(size_type)__n,
             &local_51);
  std::allocator<unsigned_char>::~allocator(&local_51);
  c = (size_t)line_no;
  for (sStack_78 = 0; uVar7 = sStack_78,
      sVar2 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size
                        (channels), uVar7 < sVar2; sStack_78 = sStack_78 + 1) {
    pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (channels,sStack_78);
    if (pvVar3->pixel_type == 1) {
      pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
               operator[](channels,sStack_78);
      if (pvVar3->requested_pixel_type == 2) {
        for (line_ptr._4_4_ = 0; line_ptr._4_4_ < num_lines; line_ptr._4_4_ = line_ptr._4_4_ + 1) {
          lVar8 = (long)line_ptr._4_4_;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (channel_offset_list,sStack_78);
          _h16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                            pixel_data_size * lVar8 * (long)width + *pvVar4 * (long)width);
          for (f32.u = 0; (int)f32.u < width; f32.u = f32.u + 1) {
            local_90.u = *(undefined2 *)
                          (images[sStack_78] +
                          (((long)line_ptr._4_4_ + c) * (long)x_stride + (long)(int)f32.u) * 2);
            local_98 = local_90;
            y_1 = (int)half_to_float(local_90);
            swap4((float *)&y_1);
            cpy4((float *)(_h16 + (long)(int)f32.u * 4),(float *)&y_1);
          }
        }
      }
      else {
        pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](channels,sStack_78);
        if (pvVar3->requested_pixel_type != 1) {
          if (err != (string *)0x0) {
            std::__cxx11::string::operator+=((string *)err,"Invalid requested_pixel_type.\n");
          }
          out_data_local._7_1_ = 0;
          line_ptr_2._4_4_ = 1;
          goto LAB_00115ec0;
        }
        for (line_ptr_1._4_4_ = 0; line_ptr_1._4_4_ < num_lines;
            line_ptr_1._4_4_ = line_ptr_1._4_4_ + 1) {
          lVar8 = (long)line_ptr_1._4_4_;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (channel_offset_list,sStack_78);
          pvStack_a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                                  pixel_data_size * lVar8 * (long)width + *pvVar4 * (long)width);
          for (local_ac = 0; local_ac < width; local_ac = local_ac + 1) {
            y_2._2_2_ = *(undefined2 *)
                         (images[sStack_78] +
                         (((long)line_ptr_1._4_4_ + c) * (long)x_stride + (long)local_ac) * 2);
            swap2((unsigned_short *)((long)&y_2 + 2));
            cpy2((unsigned_short *)(pvStack_a8 + (long)local_ac * 2),
                 (unsigned_short *)((long)&y_2 + 2));
          }
        }
      }
    }
    else {
      pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
               operator[](channels,sStack_78);
      if (pvVar3->pixel_type == 2) {
        pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](channels,sStack_78);
        if (pvVar3->requested_pixel_type == 1) {
          for (line_ptr_2._0_4_ = 0; (int)line_ptr_2 < num_lines;
              line_ptr_2._0_4_ = (int)line_ptr_2 + 1) {
            lVar8 = (long)(int)line_ptr_2;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (channel_offset_list,sStack_78);
            _f32_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                                pixel_data_size * lVar8 * (long)width + *pvVar4 * (long)width);
            for (h16_1 = (FP16)0x0; (int)h16_1 < width; h16_1.s = h16_1.s + 1) {
              line_ptr_3._4_4_ =
                   *(FP32 *)(images[sStack_78] +
                            (((long)(int)line_ptr_2 + c) * (long)x_stride + (long)(int)h16_1) * 4);
              local_c8 = line_ptr_3._4_4_;
              y_3 = (int)float_to_half_full(line_ptr_3._4_4_);
              local_cc = (FP16)y_3;
              swap2(&local_cc.u);
              cpy2((unsigned_short *)(_f32_1 + (long)(int)h16_1 * 2),&local_cc.u);
            }
          }
        }
        else {
          pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                   operator[](channels,sStack_78);
          if (pvVar3->requested_pixel_type != 2) {
            if (err != (string *)0x0) {
              std::__cxx11::string::operator+=((string *)err,"Invalid requested_pixel_type.\n");
            }
            out_data_local._7_1_ = 0;
            line_ptr_2._4_4_ = 1;
            goto LAB_00115ec0;
          }
          for (line_ptr_3._0_4_ = 0; (int)line_ptr_3 < num_lines;
              line_ptr_3._0_4_ = (int)line_ptr_3 + 1) {
            lVar8 = (long)(int)line_ptr_3;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (channel_offset_list,sStack_78);
            _val_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                                pixel_data_size * lVar8 * (long)width + *pvVar4 * (long)width);
            for (y_4 = 0; y_4 < width; y_4 = y_4 + 1) {
              local_e8 = *(float *)(images[sStack_78] +
                                   (((long)(int)line_ptr_3 + c) * (long)x_stride + (long)y_4) * 4);
              swap4(&local_e8);
              cpy4((float *)(_val_1 + (long)y_4 * 4),&local_e8);
            }
          }
        }
      }
      else {
        pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](channels,sStack_78);
        if (pvVar3->pixel_type == 0) {
          for (line_ptr_4._4_4_ = 0; line_ptr_4._4_4_ < num_lines;
              line_ptr_4._4_4_ = line_ptr_4._4_4_ + 1) {
            lVar8 = (long)line_ptr_4._4_4_;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (channel_offset_list,sStack_78);
            _val_2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                                pixel_data_size * lVar8 * (long)width + *pvVar4 * (long)width);
            for (local_fc = 0; local_fc < width; local_fc = local_fc + 1) {
              local_100 = *(uint *)(images[sStack_78] +
                                   (((long)line_ptr_4._4_4_ + c) * (long)x_stride + (long)local_fc)
                                   * 4);
              swap4(&local_100);
              cpy4((uint *)(_val_2 + (long)local_fc * 4),&local_100);
            }
          }
        }
      }
    }
  }
  if (compression_type == 0) {
    local_110._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(out_data);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_108,&local_110);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                             local_108,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )__first._M_current,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )__last._M_current);
  }
  else {
    if ((compression_type == 2) || (compression_type == 3)) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      __n_00 = mz_compressBound(sVar2);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&outSize + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140,__n_00,
                 (allocator<unsigned_char> *)((long)&outSize + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&outSize + 7));
      _uStack_150 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140,0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      bVar1 = CompressZip(pvVar5,(tinyexr_uint64 *)&stack0xfffffffffffffeb0,pvVar6,sVar2);
      if (bVar1) {
        local_154 = uStack_150;
        local_168._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(out_data);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_160,&local_168);
        local_170._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140)
        ;
        local_180._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140)
        ;
        local_178 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_180,(ulong)local_154);
        block_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                                 local_160,local_170,
                                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_178);
        line_ptr_2._4_4_ = 0;
      }
      else {
        if (err != (string *)0x0) {
          std::__cxx11::string::operator+=((string *)err,"Zip compresssion failed.\n");
        }
        out_data_local._7_1_ = 0;
        line_ptr_2._4_4_ = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140);
    }
    else if (compression_type == 1) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&outSize_1 + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,sVar2 * 3 >> 1,
                 (allocator<unsigned_char> *)((long)&outSize_1 + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&outSize_1 + 7));
      _uStack_1b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      bVar1 = CompressRle(pvVar5,(tinyexr_uint64 *)&stack0xfffffffffffffe50,pvVar6,sVar2);
      if (bVar1) {
        local_1b4 = uStack_1b0;
        local_1c8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(out_data);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1c0,&local_1c8);
        local_1d0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0)
        ;
        local_1e0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0)
        ;
        local_1d8 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_1e0,(ulong)local_1b4);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,local_1c0,
                   local_1d0,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_1d8);
        line_ptr_2._4_4_ = 0;
      }
      else {
        if (err != (string *)0x0) {
          std::__cxx11::string::operator+=((string *)err,"RLE compresssion failed.\n");
        }
        out_data_local._7_1_ = 0;
        line_ptr_2._4_4_ = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    }
    else {
      if (compression_type != 4) {
        if (compression_type == 0x80) {
          if (err != (string *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)err,"ZFP compression is disabled in this build.\n");
          }
          out_data_local._7_1_ = 0;
          line_ptr_2._4_4_ = 1;
        }
        else {
          out_data_local._7_1_ = 0;
          line_ptr_2._4_4_ = 1;
        }
        goto LAB_00115ec0;
      }
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar2 * 2 + 0x2000;
      uVar7 = (ulong)block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&data_len_2 + 3));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2,uVar7,
                 (allocator<unsigned_char> *)((long)&data_len_2 + 3));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&data_len_2 + 3))
      ;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2);
      local_210 = (uint)sVar2;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2,0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      bVar1 = CompressPiz(pvVar5,&local_210,pvVar6,sVar2,channels,width,num_lines);
      if (bVar1) {
        local_214 = local_210;
        local_228._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(out_data);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_220,&local_228);
        local_230._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2
                                );
        local_240._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2
                                );
        local_238 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_240,(ulong)local_214);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,local_220,
                   local_230,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_238);
        line_ptr_2._4_4_ = 0;
      }
      else {
        if (err != (string *)0x0) {
          std::__cxx11::string::operator+=((string *)err,"PIZ compresssion failed.\n");
        }
        out_data_local._7_1_ = 0;
        line_ptr_2._4_4_ = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outSize_2);
    }
    if (line_ptr_2._4_4_ != 0) goto LAB_00115ec0;
  }
  out_data_local._7_1_ = 1;
  line_ptr_2._4_4_ = 1;
LAB_00115ec0:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return (bool)(out_data_local._7_1_ & 1);
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if defined(TINYEXR_USE_MINIZ) && (TINYEXR_USE_MINIZ==1)
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#elif defined(TINYEXR_USE_NANOZLIB) && (TINYEXR_USE_NANOZLIB == 1)
    std::vector<unsigned char> block(nanoz_compressBound(
      static_cast<unsigned long>(buf.size())));
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "RLE compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    if (!CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines)) {
      if (err) {
        (*err) += "PIZ compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}